

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable
          (FileGenerator *this,Printer *printer)

{
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var1;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var2;
  DescriptorPool *this_00;
  char *pcVar3;
  ClassNameResolver *this_01;
  GeneratorFactory *pGVar4;
  undefined1 auVar5 [12];
  Printer *printer_00;
  _Alloc_hider this_02;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  field_type fVar9;
  int iVar10;
  Descriptor *pDVar11;
  Message *this_03;
  MessageLite *this_04;
  reference ppFVar12;
  slot_type *ppFVar13;
  slot_type *ppFVar14;
  template_ElementType<2UL> *ptVar15;
  FileDescriptor *pFVar16;
  LogMessage *pLVar17;
  allocator_type *alloc;
  allocator_type *alloc_00;
  allocator_type *extraout_RDX;
  int i;
  long lVar18;
  Printer *this_05;
  int iVar19;
  ulong uVar20;
  SharedCodeGenerator *field;
  FieldDescriptor *field_00;
  char *alloc_01;
  allocator_type *in_R9;
  _Alloc_hider this_06;
  size_type dest_i;
  iterator iVar21;
  iterator iVar22;
  string_view text;
  string_view text_00;
  string_view name;
  string_view data;
  iterator iter;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  int bytecode_estimate;
  Printer *local_1c0;
  int method_num;
  string file_data;
  FieldDescriptorSet extensions;
  LogMessage local_178;
  DynamicMessageFactory factory;
  SharedCodeGenerator shared_code_generator;
  undefined8 local_60;
  
  shared_code_generator.name_resolver_._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
  .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>._M_head_impl
       = (__uniq_ptr_data<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>,_true,_true>
          )((long)anon_var_dwarf_651463 + 5);
  if ((this->options_).opensource_runtime == false) {
    shared_code_generator.name_resolver_._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
    _M_head_impl = (__uniq_ptr_data<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>,_true,_true>
                    )((long)"is_final" + 3);
  }
  alloc_01 = (char *)&shared_code_generator;
  text._M_str = 
  "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static $final$ com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
  ;
  text._M_len = 0xc9;
  io::Printer::Print<char[6],char_const*>(printer,text,(char (*) [6])0xefea7b,(char **)alloc_01);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  if ((this->options_).opensource_runtime == true) {
    SharedCodeGenerator::SharedCodeGenerator(&shared_code_generator,this->file_,&this->options_);
    SharedCodeGenerator::GenerateDescriptors(&shared_code_generator,printer);
    SharedCodeGenerator::~SharedCodeGenerator(&shared_code_generator);
  }
  bytecode_estimate = 0;
  method_num = 0;
  lVar18 = 0;
  local_1c0 = printer;
  while( true ) {
    printer_00 = local_1c0;
    pFVar16 = this->file_;
    if (pFVar16->message_type_count_ <= lVar18) break;
    _Var1._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>._M_head_impl
         = (this->message_generators_).
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
           ._M_t;
    iVar10 = (**(code **)(*(long *)_Var1._M_t.
                                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                                   .
                                   super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                                   ._M_head_impl + 0x18))
                       (_Var1._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                        ._M_head_impl,printer);
    bytecode_estimate = bytecode_estimate + iVar10;
    alloc_01 = "private static void _clinit_autosplit_dinit_$method_num$() {\n";
    java::anon_unknown_0::MaybeRestartJavaMethod
              (printer,&bytecode_estimate,&method_num,"_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
    lVar18 = lVar18 + 1;
  }
  for (lVar18 = 0; this_05 = local_1c0, lVar18 < pFVar16->extension_count_; lVar18 = lVar18 + 1) {
    _Var2._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
    _M_head_impl = (this->extension_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                   ._M_t;
    iVar10 = (**(code **)(*(long *)_Var2._M_t.
                                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                                   .
                                   super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                                   ._M_head_impl + 0x18))
                       (_Var2._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                        ._M_head_impl,printer_00);
    bytecode_estimate = bytecode_estimate + iVar10;
    alloc_01 = "private static void _clinit_autosplit_dinit_$method_num$() {\n";
    java::anon_unknown_0::MaybeRestartJavaMethod
              (printer_00,&bytecode_estimate,&method_num,"_clinit_autosplit_dinit_$method_num$();\n"
               ,"private static void _clinit_autosplit_dinit_$method_num$() {\n");
    pFVar16 = this->file_;
  }
  text_00._M_str = "descriptor.resolveAllFeaturesImmutable();\n";
  text_00._M_len = 0x2a;
  io::Printer::Print<>(local_1c0,text_00);
  extensions.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
  .tree_.root_ = (node_type *)
                 absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
                 ::EmptyNode()::empty_node;
  extensions.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  extensions.
  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
  .
  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
  .tree_.size_ = 0;
  pFVar16 = this->file_;
  StripSourceRetentionOptions((FileDescriptorProto *)&shared_code_generator,pFVar16,false);
  file_data._M_dataplus._M_p = (pointer)&file_data.field_2;
  file_data._M_string_length = 0;
  file_data.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&shared_code_generator,&file_data);
  this_00 = pFVar16->pool_;
  pDVar11 = FileDescriptorProto::GetDescriptor();
  pcVar3 = (pDVar11->all_names_).payload_;
  name._M_len = (ulong)*(ushort *)(pcVar3 + 2);
  name._M_str = pcVar3 + ~name._M_len;
  pDVar11 = DescriptorPool::FindMessageTypeByName(this_00,name);
  if (pDVar11 != (Descriptor *)0x0) {
    DynamicMessageFactory::DynamicMessageFactory(&factory);
    this_03 = DynamicMessageFactory::GetPrototype(&factory,pDVar11);
    this_04 = &Message::New(this_03)->super_MessageLite;
    if (this_04 == (MessageLite *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_178,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0x7d,"dynamic_file_proto.get() != nullptr");
    }
    else {
      data._M_str = file_data._M_dataplus._M_p;
      data._M_len = file_data._M_string_length;
      bVar6 = MessageLite::ParseFromString(this_04,data);
      if (bVar6) {
        absl::lts_20250127::container_internal::
        btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
        ::clear((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                 *)&extensions);
        bVar6 = java::anon_unknown_0::CollectExtensions((Message *)this_04,&extensions);
        if (bVar6) {
          (*this_04->_vptr_MessageLite[1])(this_04);
          DynamicMessageFactory::~DynamicMessageFactory(&factory);
          goto LAB_00b962fc;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_178,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                   ,0x82,"CollectExtensions(*dynamic_file_proto, extensions)");
        pLVar17 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (&local_178,
                             (char (*) [59])
                             "Found unknown fields in FileDescriptorProto when building ");
        pLVar17 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (pLVar17,(string *)(local_60 & 0xfffffffffffffffc));
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (pLVar17,(char (*) [171])
                           ". It\'s likely that those fields are custom options, however, those options cannot be recognized in the builder pool. This normally should not happen. Please report a bug."
                  );
      }
      else {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_178,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                   ,0x7e,"dynamic_file_proto->ParseFromString(file_data)");
      }
    }
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_178);
  }
LAB_00b962fc:
  std::__cxx11::string::~string((string *)&file_data);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&shared_code_generator);
  if ((this->options_).strip_nonfunctional_codegen == true) {
    iVar21 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
             ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                      *)&extensions);
    file_data._M_dataplus._M_p = (pointer)iVar21.node_;
    file_data._M_string_length = CONCAT44(file_data._M_string_length._4_4_,iVar21.position_);
    while( true ) {
      field = &shared_code_generator;
      iVar22 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                      *)&extensions);
      shared_code_generator.name_resolver_._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
      _M_head_impl = (__uniq_ptr_data<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>,_true,_true>
                      )iVar22.node_;
      shared_code_generator.file_._0_4_ = iVar22.position_;
      bVar6 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
              ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                            *)&file_data,(iterator *)field);
      if (!bVar6) break;
      ppFVar12 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                              *)&file_data);
      bVar6 = GenerateDescriptorInitializationCodeForImmutable::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)*ppFVar12,(FieldDescriptor *)field);
      this_02 = file_data._M_dataplus;
      if (bVar6) {
        bVar6 = absl::lts_20250127::container_internal::
                btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                ::is_internal((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                               *)file_data._M_dataplus._M_p);
        this_06 = file_data._M_dataplus;
        iVar10 = (int)file_data._M_string_length;
        if (!bVar6) {
          uVar20 = file_data._M_string_length & 0xffffffff;
          alloc_00 = alloc;
          file_data._M_string_length._0_1_ = (byte)file_data._M_string_length;
          do {
            field_00 = (FieldDescriptor *)(ulong)(byte)file_data._M_string_length;
            absl::lts_20250127::container_internal::
            btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
            ::value_destroy((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                             *)this_02._M_p,(byte)file_data._M_string_length,alloc_00);
            while( true ) {
              iVar10 = (int)file_data._M_string_length + 1;
              file_data._M_string_length = CONCAT44(file_data._M_string_length._4_4_,iVar10);
              bVar8 = absl::lts_20250127::container_internal::
                      btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                      ::finish((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                *)this_02._M_p);
              iVar19 = (int)uVar20;
              if ((int)(uint)bVar8 <= iVar10) {
                bVar8 = absl::lts_20250127::container_internal::
                        btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                        ::finish((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                  *)this_02._M_p);
                extensions.
                super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                .
                super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                .tree_.size_ = extensions.
                               super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                               .
                               super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                               .tree_.size_ - (long)(int)((uint)bVar8 - iVar19);
                ptVar15 = absl::lts_20250127::container_internal::
                          btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
                          ::GetField<2ul>((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
                                           *)this_02._M_p);
                ptVar15[2] = (template_ElementType<2UL>)uVar20;
                file_data._M_string_length = CONCAT44(file_data._M_string_length._4_4_,iVar19);
                iVar22._8_8_ = uVar20;
                iVar22.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                                *)file_data._M_dataplus._M_p;
                iVar22 = absl::lts_20250127::container_internal::
                         btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                         ::rebalance_after_delete
                                   ((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                     *)&extensions,iVar22);
                auVar5 = iVar22._0_12_;
                this_05 = local_1c0;
                goto LAB_00b9654f;
              }
              ppFVar12 = absl::lts_20250127::container_internal::
                         btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                         ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                                      *)&file_data);
              bVar6 = GenerateDescriptorInitializationCodeForImmutable::anon_class_1_0_00000001::
                      operator()((anon_class_1_0_00000001 *)*ppFVar12,field_00);
              if (bVar6) break;
              uVar20 = (ulong)(iVar19 + 1);
              ppFVar13 = absl::lts_20250127::container_internal::
                         btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                         ::slot((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                 *)this_02._M_p,(long)iVar19);
              field_00 = (FieldDescriptor *)(long)(int)file_data._M_string_length;
              ppFVar14 = absl::lts_20250127::container_internal::
                         btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                         ::slot((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                                 *)this_02._M_p,(size_type)field_00);
              *ppFVar13 = *ppFVar14;
            }
            alloc_00 = extraout_RDX;
          } while( true );
        }
        dest_i = (size_type)(int)file_data._M_string_length;
        factory.super_MessageFactory._vptr_MessageFactory = (_func_int **)file_data._M_dataplus._M_p
        ;
        factory.pool_._0_4_ = (int)file_data._M_string_length;
        absl::lts_20250127::container_internal::
        btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
        ::value_destroy((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                         *)file_data._M_dataplus._M_p,(byte)file_data._M_string_length,alloc);
        bVar6 = absl::lts_20250127::container_internal::
                btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                ::is_internal((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                               *)this_06._M_p);
        if (bVar6) {
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
          ::operator--((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                        *)&factory);
          bVar7 = absl::lts_20250127::container_internal::
                  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                  ::is_leaf((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                             *)factory.super_MessageFactory._vptr_MessageFactory);
          if (!bVar7) {
            __assert_fail("iter.node_->is_leaf()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                          ,0x98c,
                          "iterator absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>>::erase(iterator) [Params = absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>]"
                         );
          }
          absl::lts_20250127::container_internal::
          btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
          ::transfer((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                      *)this_06._M_p,dest_i,(long)(int)factory.pool_,
                     (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                      *)factory.super_MessageFactory._vptr_MessageFactory,(allocator_type *)alloc_01
                    );
          this_06._M_p = (pointer)factory.super_MessageFactory;
        }
        else {
          fVar9 = absl::lts_20250127::container_internal::
                  btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                  ::finish((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                            *)this_06._M_p);
          this_05 = local_1c0;
          alloc_01 = (char *)this_06;
          absl::lts_20250127::container_internal::
          btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
          ::transfer_n((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                        *)this_06._M_p,(ulong)(byte)(fVar9 - (char)(iVar10 + 1U)),dest_i,
                       (ulong)(iVar10 + 1U & 0xff),
                       (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                        *)this_06._M_p,in_R9);
        }
        fVar9 = absl::lts_20250127::container_internal::
                btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                ::finish((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          *)this_06._M_p);
        ptVar15 = absl::lts_20250127::container_internal::
                  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
                  ::GetField<2ul>((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
                                   *)this_06._M_p);
        ptVar15[2] = fVar9 + 0xff;
        extensions.
        super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
        .
        super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
        .tree_.size_ = extensions.
                       super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                       .
                       super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                       .tree_.size_ - 1;
        iter.position_ = (int)factory.pool_;
        iter.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                      *)factory.super_MessageFactory._vptr_MessageFactory;
        iter._12_4_ = 0;
        iVar22 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                 ::rebalance_after_delete
                           ((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                             *)&extensions,iter);
        auVar5 = iVar22._0_12_;
        shared_code_generator.name_resolver_._M_t.
        super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
        .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
        _M_head_impl = (__uniq_ptr_data<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>,_true,_true>
                        )iVar22.node_;
        shared_code_generator.file_._0_4_ = iVar22.position_;
        if (bVar6) {
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
          ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                        *)&shared_code_generator);
          auVar5._8_4_ = (int)shared_code_generator.file_;
          auVar5._0_8_ = shared_code_generator.name_resolver_._M_t.
                         super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>
                         ._M_head_impl;
        }
LAB_00b9654f:
        file_data._M_dataplus._M_p = auVar5._0_8_;
        file_data._M_string_length = CONCAT44(file_data._M_string_length._4_4_,auVar5._8_4_);
      }
      else {
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
        ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                      *)&file_data);
      }
    }
  }
  for (iVar10 = 0; iVar10 < this->file_->dependency_count_; iVar10 = iVar10 + 1) {
    pFVar16 = FileDescriptor::dependency(this->file_,iVar10);
    bVar6 = ShouldIncludeDependency(this,pFVar16,false);
    if (bVar6) {
      this_01 = this->name_resolver_;
      pFVar16 = FileDescriptor::dependency(this->file_,iVar10);
      ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
                ((string *)&shared_code_generator,this_01,pFVar16);
      text_01._M_str = "$dependency$.getDescriptor();\n";
      text_01._M_len = 0x1e;
      io::Printer::Print<char[11],std::__cxx11::string>
                (this_05,text_01,(char (*) [11])0x10a785f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shared_code_generator);
      std::__cxx11::string::~string((string *)&shared_code_generator);
    }
  }
  if (extensions.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
      .tree_.size_ != 0) {
    text_02._M_str =
         "com.google.protobuf.ExtensionRegistry registry =\n    com.google.protobuf.ExtensionRegistry.newInstance();\n"
    ;
    text_02._M_len = 0x6a;
    io::Printer::Print<>(this_05,text_02);
    iVar21 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
             ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                      *)&extensions);
    shared_code_generator.name_resolver_._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
    _M_head_impl = (__uniq_ptr_data<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>,_true,_true>
                    )iVar21.node_;
    shared_code_generator.file_._0_4_ = iVar21.position_;
    iVar22 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                    *)&extensions);
    factory.super_MessageFactory._vptr_MessageFactory = (_func_int **)iVar22.node_;
    factory.pool_._0_4_ = iVar22.position_;
    while( true ) {
      bVar6 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
              ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                            *)&shared_code_generator,(iterator *)&factory);
      if (!bVar6) break;
      ppFVar12 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                              *)&shared_code_generator);
      pGVar4 = (this->generator_factory_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>.
               _M_head_impl;
      (*pGVar4->_vptr_GeneratorFactory[4])(&file_data,pGVar4,*ppFVar12);
      iVar10 = (**(code **)(*(long *)file_data._M_dataplus._M_p + 0x20))
                         (file_data._M_dataplus._M_p,this_05);
      bytecode_estimate = bytecode_estimate + iVar10;
      java::anon_unknown_0::MaybeRestartJavaMethod
                (this_05,&bytecode_estimate,&method_num,
                 "_clinit_autosplit_dinit_$method_num$(registry);\n",
                 "private static void _clinit_autosplit_dinit_$method_num$(\n    com.google.protobuf.ExtensionRegistry registry) {\n"
                );
      if (file_data._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)file_data._M_dataplus._M_p + 8))();
      }
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
      ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                    *)&shared_code_generator);
    }
    text_03._M_str =
         "com.google.protobuf.Descriptors.FileDescriptor\n    .internalUpdateFileDescriptor(descriptor, registry);\n"
    ;
    text_03._M_len = 0x68;
    io::Printer::Print<>(this_05,text_03);
  }
  io::Printer::Outdent(this_05);
  text_04._M_str = "}\n";
  text_04._M_len = 2;
  io::Printer::Print<>(this_05,text_04);
  absl::lts_20250127::container_internal::
  btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
  ::~btree_container((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                      *)&extensions);
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForImmutable(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Descriptors.FileDescriptor\n"
      "    getDescriptor() {\n"
      "  return descriptor;\n"
      "}\n"
      "private static $final$ com.google.protobuf.Descriptors.FileDescriptor\n"
      "    descriptor;\n"
      "static {\n",
      // TODO: Mark this as final.
      "final", options_.opensource_runtime ? "" : "final");
  printer->Indent();

  if (options_.opensource_runtime) {
    SharedCodeGenerator shared_code_generator(file_, options_);
    shared_code_generator.GenerateDescriptors(printer);
  } else {
  }

  int bytecode_estimate = 0;
  int method_num = 0;

  for (int i = 0; i < file_->message_type_count(); i++) {
    bytecode_estimate +=
        message_generators_[i]->GenerateStaticVariableInitializers(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    bytecode_estimate +=
        extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  // Feature resolution for Java features uses extension registry
  // which must happen after internalInit() from
  // GenerateNonNestedInitializationCode
  printer->Print("descriptor.resolveAllFeaturesImmutable();\n");

  // Proto compiler builds a DescriptorPool, which holds all the descriptors to
  // generate, when processing the ".proto" files. We call this DescriptorPool
  // the parsed pool (a.k.a. file_->pool()).
  //
  // Note that when users try to extend the (.*)DescriptorProto in their
  // ".proto" files, it does not affect the pre-built FileDescriptorProto class
  // in proto compiler. When we put the descriptor data in the file_proto, those
  // extensions become unknown fields.
  //
  // Now we need to find out all the extension value to the (.*)DescriptorProto
  // in the file_proto message, and prepare an ExtensionRegistry to return.
  //
  // To find those extensions, we need to parse the data into a dynamic message
  // of the FileDescriptor based on the builder-pool, then we can use
  // reflections to find all extension fields
  FieldDescriptorSet extensions;
  CollectExtensions(*file_, &extensions);

  if (options_.strip_nonfunctional_codegen) {
    // Skip feature extensions, which are a visible (but non-functional)
    // deviation between editions and legacy syntax.
    absl::erase_if(extensions, [](const FieldDescriptor* field) {
      return field->containing_type()->full_name() == "google.protobuf.FeatureSet";
    });
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), true)) {
      std::string dependency =
          name_resolver_->GetImmutableClassName(file_->dependency(i));
      printer->Print("$dependency$.getDescriptor();\n", "dependency",
                     dependency);
    }
  }

  if (!extensions.empty()) {
    // Must construct an ExtensionRegistry containing all existing extensions
    // and use it to parse the descriptor data again to recognize extensions.
    printer->Print(
        "com.google.protobuf.ExtensionRegistry registry =\n"
        "    com.google.protobuf.ExtensionRegistry.newInstance();\n");
    FieldDescriptorSet::iterator it;
    for (const FieldDescriptor* field : extensions) {
      std::unique_ptr<ExtensionGenerator> generator(
          generator_factory_->NewExtensionGenerator(field));
      bytecode_estimate += generator->GenerateRegistrationCode(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_dinit_$method_num$(registry);\n",
          "private static void _clinit_autosplit_dinit_$method_num$(\n"
          "    com.google.protobuf.ExtensionRegistry registry) {\n");
    }
    printer->Print(
        "com.google.protobuf.Descriptors.FileDescriptor\n"
        "    .internalUpdateFileDescriptor(descriptor, registry);\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}